

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O1

int __thiscall Qclass::execute(Qclass *this)

{
  double dVar1;
  char cVar2;
  Qclass *pQVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  double dVar12;
  long local_248;
  ofstream outfile;
  uint auStack_230 [56];
  ios_base local_150 [264];
  double (*local_48) [4];
  Qclass *local_40;
  int local_34;
  
  local_34 = this->goal_x * 0x32 + this->goal_y;
  std::ofstream::ofstream((ostream *)&local_248);
  std::ofstream::open((char *)&local_248,0x1445e0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The path followed by the robot is:",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  local_40 = this;
  *(undefined8 *)(&outfile + *(long *)(local_248 + -0x18)) = 6;
  if (local_34 != 5000) {
    local_48 = local_40->Q;
    uVar9 = 0;
    iVar11 = 0x2f;
    iVar10 = 0x2f;
    do {
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      plVar6 = (long *)std::ostream::operator<<((ostream *)poVar5,iVar10);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      *(uint *)((long)auStack_230 + *(long *)(local_248 + -0x18)) =
           *(uint *)((long)auStack_230 + *(long *)(local_248 + -0x18)) & 0xfffffefb | 4;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_248,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"   ",3);
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xfffffefb | 4;
      std::ostream::operator<<((ostream *)poVar5,iVar10);
      cVar2 = (char)(ostream *)&local_248;
      std::ios::widen((char)*(undefined8 *)(local_248 + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      iVar4 = iVar11 * 0x32 + iVar10;
      uVar7 = 0;
      dVar12 = -10000.0;
      do {
        dVar1 = local_48[iVar4][uVar7];
        if (dVar12 <= dVar1) {
          uVar9 = uVar7 & 0xffffffff;
        }
        dVar12 = (double)(-(ulong)(dVar1 < dVar12) & (ulong)dVar12 |
                         ~-(ulong)(dVar1 < dVar12) & (ulong)dVar1);
        uVar7 = uVar7 + 1;
      } while (uVar7 != 4);
      iVar8 = (int)uVar9;
      local_48[iVar4][iVar8] = -1000.0;
      iVar11 = (iVar11 + (uint)(iVar8 == 0)) - (uint)(iVar8 == 1);
      iVar10 = (iVar10 + (uint)(iVar8 == 2)) - (uint)(iVar8 == 3);
    } while (iVar11 * 0x32 + iVar10 != local_34);
  }
  pQVar3 = local_40;
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_40->goal_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
  std::ostream::operator<<((ostream *)poVar5,pQVar3->goal_y);
  *(uint *)((long)auStack_230 + *(long *)(local_248 + -0x18)) =
       *(uint *)((long)auStack_230 + *(long *)(local_248 + -0x18)) & 0xfffffefb | 4;
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_248,pQVar3->goal_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"   ",3);
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<((ostream *)poVar5,pQVar3->goal_y);
  std::ofstream::close();
  local_248 = _VTT;
  *(undefined8 *)((long)&local_248 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&outfile);
  std::ios_base::~ios_base(local_150);
  return 0;
}

Assistant:

int Qclass::execute() {   // Executes the learned algorithm for given start
  int start_x = 47;
  int start_y = 47;
  int last_state = 5000;
  double max = -10000;
  int action = 0;
  int goal_state = findState(goal_x, goal_y);
  std::ofstream outfile;
  outfile.open("Co_ordinates.txt", std::ios::out | std::ios::trunc);
  std::cout << "The path followed by the robot is:" << std::endl;
  outfile.precision(6);
  while (last_state != goal_state) {
    int start_state;
    std::cout << start_x << "," << start_y << std::endl;
    outfile << std::fixed << start_x << "   " << std::fixed << start_y;
    outfile << std::endl;
    start_state = findState(start_x, start_y);
    for (int i = 0; i < 4; i++) {
      if (Q[start_state][i] >= max) {
        max = Q[start_state][i];
        action = i;
      }
    }
    Q[start_state][action] = -1000;
    if (action == 0) {
      start_x = start_x + 1;
    }
    if (action == 1) {
      start_x = start_x - 1;
    }
    if (action == 2) {
      start_y = start_y + 1;
    }
    if (action == 3) {
      start_y = start_y - 1;
    }
    last_state = findState(start_x, start_y);
    max = -10000;
  }
  std::cout << goal_x << "," << goal_y;
  outfile << std::fixed << goal_x << "   " << std::fixed << goal_y;
  outfile.close();
  return 0;
}